

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Decompose_LDLt
          (TPZSkylMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  _List_node_base *p_Var1;
  size_t *psVar2;
  undefined8 uVar3;
  char cVar4;
  complex<float> **ppcVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  _List_node_base *p_Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  complex<float> *pcVar14;
  long lVar15;
  _List_node_base *p_Var16;
  long lVar17;
  complex<float> *pcVar18;
  _List_node_base *p_Var19;
  long lVar20;
  float fVar21;
  float __z;
  undefined8 uVar22;
  undefined8 uVar23;
  _ComplexT _Var24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  
  cVar4 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar4 != '\0') {
    if (cVar4 == '\x04') {
      return 1;
    }
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Decompose_LDLt(std::list<int64_t> &) [TVar = std::complex<float>]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar7 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (1 < CONCAT44(extraout_var,iVar7)) {
    lVar15 = 1;
    local_80 = 2;
    local_88 = 3;
    local_78 = 8;
    local_90 = 0x10;
    do {
      ppcVar5 = (this->fElem).fStore;
      lVar8 = (long)ppcVar5[lVar15 + 1] - (long)ppcVar5[lVar15] >> 3;
      if (0 < lVar8) {
        p_Var16 = (_List_node_base *)((lVar15 - lVar8) + 1);
        lVar11 = local_80 - lVar8;
        lVar12 = local_88 - lVar8;
        lVar8 = local_90 + lVar8 * -8;
        p_Var10 = p_Var16;
        do {
          ppcVar5 = (this->fElem).fStore;
          pcVar14 = ppcVar5[(long)p_Var10];
          lVar9 = (long)ppcVar5[(long)((long)&p_Var10->_M_next + 1)] - (long)pcVar14 >> 3;
          p_Var1 = (_List_node_base *)((long)&p_Var10->_M_next + 1);
          p_Var19 = (_List_node_base *)((long)p_Var1 - lVar9);
          if ((long)p_Var19 < (long)p_Var16) {
            p_Var19 = p_Var16;
          }
          if ((long)p_Var19 < (long)p_Var10) {
            lVar17 = (long)&ppcVar5[lVar15]->_M_value + local_78;
            lVar9 = lVar12 - lVar9;
            lVar20 = lVar9;
            if (lVar9 < lVar11) {
              lVar20 = lVar11;
            }
            lVar13 = (long)&pcVar14->_M_value + lVar8;
            fVar28 = 0.0;
            fVar29 = 0.0;
            do {
              uVar23 = *(undefined8 *)(lVar17 + lVar20 * -8);
              uVar3 = *(undefined8 *)(lVar13 + lVar20 * -8);
              fVar26 = (float)((ulong)uVar3 >> 0x20);
              fVar27 = (float)((ulong)uVar23 >> 0x20);
              fVar21 = (float)uVar3 * (float)uVar23 - fVar26 * fVar27;
              uVar22 = CONCAT44(fVar26 * fVar27,fVar21);
              fVar25 = (float)uVar23 * fVar26 + fVar27 * (float)uVar3;
              if ((NAN(fVar21)) && (NAN(fVar25))) {
                uVar22 = __mulsc3(uVar23,CONCAT44(fVar27,fVar27),uVar3,fVar26);
                fVar25 = (float)((ulong)uVar22 >> 0x20);
              }
              _Var24 = (this->fElem).fStore[(long)p_Var19]->_M_value;
              fVar26 = (float)_Var24;
              fVar27 = (float)(_Var24 >> 0x20);
              fVar21 = (float)uVar22 * fVar26 - fVar27 * fVar25;
              fVar25 = fVar26 * fVar25 + (float)uVar22 * fVar27;
              if ((NAN(fVar21)) && (NAN(fVar25))) {
                uVar23 = __mulsc3();
                fVar21 = (float)uVar23;
                fVar25 = (float)((ulong)uVar23 >> 0x20);
              }
              fVar28 = fVar28 + fVar21;
              fVar29 = fVar29 + fVar25;
              p_Var19 = (_List_node_base *)((long)&p_Var19->_M_next + 1);
              lVar17 = lVar17 + -8;
              lVar13 = lVar13 + -8;
            } while ((long)p_Var19 < (long)p_Var10);
            if (lVar9 < lVar11) {
              lVar9 = lVar11;
            }
            pcVar18 = (complex<float> *)(lVar17 + lVar9 * -8);
          }
          else {
            pcVar18 = ppcVar5[lVar15] + (lVar15 - (long)p_Var19);
            pcVar14 = pcVar14 + ((long)p_Var10 - (long)p_Var19);
            fVar28 = 0.0;
            fVar29 = 0.0;
          }
          fVar29 = (float)(pcVar18->_M_value >> 0x20) - fVar29;
          _Var24 = CONCAT44(fVar29,(float)pcVar18->_M_value - fVar28);
          pcVar18->_M_value = _Var24;
          if (pcVar14 == pcVar18) {
            fVar29 = cabsf((float)pcVar18->_M_value);
            if (ABS(fVar29) < 1e-07) {
              p_Var19 = (_List_node_base *)operator_new(0x18);
              p_Var19[1]._M_next = p_Var10;
              std::__detail::_List_node_base::_M_hook(p_Var19);
              psVar2 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                        _M_size;
              *psVar2 = *psVar2 + 1;
              _Var24 = 0x3f800000;
              goto LAB_00cb7e09;
            }
          }
          else {
            _Var24 = __divsc3(_Var24,CONCAT44(fVar29,fVar29),(int)pcVar14->_M_value,
                              *(undefined4 *)((long)&pcVar14->_M_value + 4));
LAB_00cb7e09:
            pcVar18->_M_value = _Var24;
          }
          lVar12 = lVar12 + 1;
          lVar8 = lVar8 + 8;
          bVar6 = (long)p_Var10 < lVar15;
          p_Var10 = p_Var1;
        } while (bVar6);
      }
      lVar15 = lVar15 + 1;
      local_80 = local_80 + 1;
      local_88 = local_88 + 1;
      local_78 = local_78 + 8;
      local_90 = local_90 + 8;
    } while (lVar15 != CONCAT44(extraout_var,iVar7));
  }
  lVar15 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (lVar15 != 0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(this,lVar15 + -1);
    fVar29 = cabsf(__z);
    if (ABS(fVar29) < 1e-07) {
      lVar15 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)(lVar15 + -1);
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar2 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])
                (this,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + -1);
    }
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}